

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-run.c
# Opt level: O0

ztresult_t
zt_run_program(ztast_t *ast,ztstruct_t *metastruct,ztregion_t *regions,int nregions,
              ztloader_t **loaders,int nloaders,void *structure,char *errbuf)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  ztregion_t *in_RSI;
  ztstruct_t *in_RDI;
  undefined8 in_R8;
  undefined4 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ztresult_t zVar1;
  
  if (*(long *)in_RDI == 0) {
    zVar1 = 0x40;
  }
  else {
    zVar1 = zt_run_statements((ztast_statement_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI,(int)((ulong)in_RDX >> 0x20),
                              (ztloader_t **)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                              (int)((ulong)in_R8 >> 0x20),
                              (void *)CONCAT44(nloaders,in_stack_00000010),(char *)loaders);
  }
  return zVar1;
}

Assistant:

ztresult_t zt_run_program(const ztast_t     *ast,
                          const ztstruct_t  *metastruct,
                          const ztregion_t  *regions,
                          int                nregions,
                          ztloader_t       **loaders,
                          int                nloaders,
                          void              *structure,
                          char              *errbuf)
{
  if (ast->program == NULL)
    return ztresult_NO_PROGRAM;

  return zt_run_statements(ast->program->statements,
                           metastruct,
                           regions,
                           nregions,
                           loaders,
                           nloaders,
                           structure,
                           errbuf);
}